

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O1

void __thiscall
el::base::debug::StackTrace::StackTraceEntry::~StackTraceEntry(StackTraceEntry *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->m_addr)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_addr).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_hex)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_hex).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_demangled)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_demangled).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_location)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_location).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

StackTraceEntry(std::size_t index, char* loc) :
      m_index(index),
      m_location(loc) {
    }